

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O1

int32 bio_fread_3d(void ****arr,size_t e_sz,uint32 *d1,uint32 *d2,uint32 *d3,FILE *fp,uint32 swap,
                  uint32 *chksum)

{
  int32 iVar1;
  uint32 uVar2;
  void ***pppvVar3;
  char *fmt;
  long ln;
  uint32 l_d3;
  void *raw;
  uint32 local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  size_t local_50;
  ulong local_48;
  ulong local_40;
  void *local_38;
  
  iVar1 = bio_fread(&local_54,4,1,fp,swap,chksum);
  if (iVar1 == 1) {
    local_50 = e_sz;
    iVar1 = bio_fread(&local_58,4,1,fp,swap,chksum);
    if (iVar1 == 1) {
      iVar1 = bio_fread(&local_5c,4,1,fp,swap,chksum);
      if (iVar1 == 1) {
        uVar2 = bio_fread_1d(&local_38,local_50,&local_60,fp,swap,chksum);
        if (uVar2 != local_60) {
          return -1;
        }
        local_40 = (ulong)local_58;
        local_48 = (ulong)local_5c;
        if (local_60 == local_58 * local_54 * local_5c) {
          pppvVar3 = (void ***)
                     __ckd_alloc_3d_ptr((ulong)local_54,local_40,local_48,local_38,local_50,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
                                        ,0x1e4);
          *arr = pppvVar3;
          *d1 = local_54;
          *d2 = (uint32)local_40;
          *d3 = (uint32)local_48;
          return local_60;
        }
        __assert_fail("n == l_d1 * l_d2 * l_d3",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
                      ,0x1e2,
                      "int32 bio_fread_3d(void ****, size_t, uint32 *, uint32 *, uint32 *, FILE *, uint32, uint32 *)"
                     );
      }
      if (iVar1 == 0) {
        fmt = "Unable to read complete data";
        ln = 0x1d6;
      }
      else {
        fmt = "OS error in bio_fread_3d";
        ln = 0x1d9;
      }
    }
    else if (iVar1 == 0) {
      fmt = "Unable to read complete data";
      ln = 0x1cc;
    }
    else {
      fmt = "OS error in bio_fread_3d";
      ln = 0x1cf;
    }
  }
  else if (iVar1 == 0) {
    fmt = "Unable to read complete data";
    ln = 0x1c2;
  }
  else {
    fmt = "OS error in bio_fread_3d";
    ln = 0x1c5;
  }
  err_msg_system(ERR_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
                 ,ln,fmt);
  return -1;
}

Assistant:

int32
bio_fread_3d(void ****arr,
             size_t e_sz,
             uint32 *d1,
             uint32 *d2,
             uint32 *d3,
             FILE *fp,
             uint32 swap,
             uint32 *chksum)
{
    uint32 l_d1;
    uint32 l_d2;
    uint32 l_d3;
    uint32 n;
    void *raw;
    size_t ret;

    ret = bio_fread(&l_d1, sizeof(uint32), 1, fp, swap, chksum);
    if (ret != 1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to read complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fread_3d");
	}
	return -1;
    }
    ret = bio_fread(&l_d2, sizeof(uint32), 1, fp, swap, chksum);
    if (ret != 1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to read complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fread_3d");
	}
	return -1;
    }
    ret = bio_fread(&l_d3, sizeof(uint32), 1, fp, swap, chksum);
    if (ret != 1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to read complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fread_3d");
	}
	return -1;
    }

    if (bio_fread_1d(&raw, e_sz, &n, fp, swap, chksum) != (int32)n) {
	return -1;
    }

    assert(n == l_d1 * l_d2 * l_d3);

    *arr = ckd_alloc_3d_ptr(l_d1, l_d2, l_d3, raw, e_sz);
    *d1 = l_d1;
    *d2 = l_d2;
    *d3 = l_d3;
    
    return n;
}